

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O1

LispPTR find_symbol(char *char_base,DLword offset,DLword length,LispPTR hashtbl,DLword fatp,
                   DLword lispp)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  LispPTR array;
  LispPTR datum;
  LispPTR array_00;
  LispPTR datum_00;
  LispPTR LVar6;
  uint uVar7;
  uint index;
  char *char1;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  DLword *pDVar11;
  uint *puVar12;
  uint local_6c;
  
  if (hashtbl == 0) {
    return 0xffffffff;
  }
  if (lispp == 0) {
    uVar5 = compute_hash(char_base,offset,length);
  }
  else {
    uVar5 = compute_lisp_hash(char_base,offset,length,fatp);
  }
  uVar4 = length ^ uVar5 ^ uVar5 >> 8;
  if ((hashtbl & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)hashtbl);
  }
  datum = *(LispPTR *)(Lisp_world + hashtbl);
  datum_00 = *(LispPTR *)(Lisp_world + (ulong)hashtbl + 2);
LAB_00122834:
  array = car(datum);
  datum = cdr(datum);
  array_00 = car(datum_00);
  datum_00 = cdr(datum_00);
  if ((array & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)array);
  }
  iVar1 = *(int *)(Lisp_world + (ulong)array + 4);
  if (iVar1 == 0) {
    return 0xffffffff;
  }
  uVar10 = (long)(ulong)(uint)uVar5 % (long)iVar1 & 0xffffffff;
  uVar8 = (int)((long)(ulong)(uint)uVar5 % (long)(iVar1 + -2)) + 1U & 0xffff;
  do {
    while( true ) {
      index = (uint)uVar10 & 0xffff;
      LVar6 = aref1(array_00,index);
      if ((LVar6 & 0xff) != ((uint)uVar4 + ((uVar4 >> 1) / 0x7f) * -0xfe + 2 & 0xffff)) break;
      LVar6 = aref1(array,index);
      uVar2 = LVar6 & 0xffff;
      if ((LVar6 & 0xfff0000) != 0xe0000) {
        uVar2 = LVar6;
      }
      uVar9 = (ulong)uVar2;
      if ((uVar2 & 0xfff0000) == 0) {
        puVar12 = (uint *)(AtomSpace + (ulong)(uVar2 * 5) * 2);
      }
      else {
        if ((uVar2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        puVar12 = (uint *)(Lisp_world + uVar9);
      }
      if ((uVar2 & 0xfff0000) == 0) {
        pDVar11 = AtomSpace + (ulong)(uVar2 * 5) * 2;
      }
      else {
        if ((uVar2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        pDVar11 = Lisp_world + uVar9;
      }
      uVar9 = (ulong)((*puVar12 & 0xfffffff) * 2) + (long)Lisp_world;
      if (*(byte *)(uVar9 ^ 3) == length) {
        uVar7 = (uint)((ulong)*(undefined8 *)(pDVar11 + 6) >> 0x2d);
        char1 = (char *)(uVar9 + (uVar7 & 1) + 1);
        if (lispp == 0) {
          LVar6 = compare_chars(char1,char_base + ((ulong)offset << (fatp != 0)),length);
        }
        else {
          LVar6 = compare_lisp_chars(char1,char_base + ((ulong)offset << (fatp != 0)),length,
                                     (ushort)uVar7 & 1,fatp);
        }
        if (LVar6 != 1) goto LAB_00122a1a;
        bVar3 = false;
        local_6c = uVar2;
      }
      else {
LAB_00122a1a:
        uVar10 = (long)(ulong)(index + uVar8) % (long)iVar1 & 0xffffffff;
        bVar3 = true;
      }
      if (!bVar3) {
        return local_6c;
      }
    }
    if ((LVar6 & 0xff) == 0) break;
    uVar10 = (long)(int)(index + uVar8) % (long)iVar1 & 0xffffffff;
  } while( true );
  if (datum_00 == 0) {
    return 0xffffffff;
  }
  goto LAB_00122834;
}

Assistant:

LispPTR find_symbol(const char *char_base, DLword offset, DLword length, LispPTR hashtbl, DLword fatp,
                    DLword lispp)

/* T => the "chars" coming in are 16-bit */
/* T => the incoming chars are in LISP space */
{
  DLword hashval, ehashval, h2, ehash, indexvar;
  int arraylen;
  struct hashtable *hashtbladdr;
#ifdef BIGATOMS
  LispPTR vecs, hashes;
#endif /* BIGATOMS */

  LispPTR vec, hash;
  struct arrayheader *vec68k;
  int fatpnamep;

  if (!hashtbl) return (0xffffffff);

  if (lispp)
    hashval = compute_lisp_hash(char_base, offset, length, fatp);
  else
    hashval = compute_hash(char_base, offset, length);

  ehashval = Entry_hash(length, hashval);
  hashtbladdr = (struct hashtable *)NativeAligned4FromLAddr(hashtbl);

  /* Move our string ptr up by offset, allowing for fatness */
  if (fatp)
    char_base += (offset << 1);
  else
    char_base += offset;

#ifdef BIGATOMS
  vecs = hashtbladdr->table;
  hashes = hashtbladdr->hash;

loop_thru_hashtables:

  vec = car(vecs);
  vecs = cdr(vecs);
  hash = car(hashes);
  hashes = cdr(hashes);
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#else
  vec = hashtbladdr->table;
  hash = hashtbladdr->hash;
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#endif /* BIGATOMS */

retry:
  /* the aref1 returns a smallp, which is always <256, so trim it */
  while (ehashval != (ehash = 0xFF & aref1(hash, indexvar))) {
    if (ehash == NIL) { /* Ran out of entries in this table; try next or fail */
#ifdef BIGATOMS
      if (hashes == NIL) return (0xffffffff); /* Last table.  Fail. */
      goto loop_thru_hashtables;
#else
      return (0xffffffff);
#endif /* BIGATOMS */
    }
    indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
  }
  /*   if ((indexvar&0xffff) != NIL) */
  {
    LispPTR index;
    PNCell *pnptr;
    char *pname_base;

    index = aref1(vec, indexvar);
    if ((index & SEGMASK) == S_POSITIVE) index &= 0xFFFF;

    pnptr = (PNCell *)GetPnameCell(index);
    fatpnamep = ((PLCell *)GetPropCell(index))->fatpnamep;
    pname_base = (char *)NativeAligned2FromLAddr(pnptr->pnamebase);
    if ((length == GETBYTE(pname_base)) &&
        (T == ((lispp) ? compare_lisp_chars((pname_base + 1 + fatpnamep), char_base, length,
                                            fatpnamep, fatp)
                       : compare_chars((pname_base + 1 + fatpnamep), char_base, length)))) {
      return (index);
    } else {
      indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
      goto retry;
    }
  }
  /*   else return(0xffffffff); */ /* can't find */
}